

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::ByteSizeLong
          (DictionaryValue_KeyValuePair *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (this->key_ == (Value *)0x0 ||
      this == (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Value>(this->key_);
    sVar2 = sVar2 + 1;
  }
  if (this->value_ != (Value *)0x0 &&
      this != (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Value>(this->value_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t DictionaryValue_KeyValuePair::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.Value key = 1;
  if (this->_internal_has_key()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *key_);
  }

  // .CoreML.Specification.MILSpec.Value value = 2;
  if (this->_internal_has_value()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *value_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}